

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O1

void printf_test(void)

{
  run_container_t *run;
  
  run = run_container_create();
  _assert_true((unsigned_long)run,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
               ,0x16);
  run_container_add(run,1);
  run_container_add(run,2);
  run_container_add(run,3);
  run_container_add(run,10);
  run_container_add(run,10000);
  run_container_printf(run);
  putchar(10);
  run_container_free(run);
  return;
}

Assistant:

DEFINE_TEST(printf_test) {
    run_container_t* B = run_container_create();

    assert_non_null(B);

    run_container_add(B, 1);
    run_container_add(B, 2);
    run_container_add(B, 3);
    run_container_add(B, 10);
    run_container_add(B, 10000);

    run_container_printf(B);
    printf("\n");

    run_container_free(B);
}